

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_fixed_wnaf_small_helper(int *wnaf,int *wnaf_expected,int w)

{
  undefined1 *puVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  secp256k1_scratch *psVar5;
  long lVar6;
  code *pcVar7;
  secp256k1_scalar *psVar8;
  long extraout_RDX;
  secp256k1_scratch *scratch;
  size_t sVar9;
  secp256k1_gej *r;
  ulong uVar10;
  secp256k1_strauss_point_state *psVar11;
  secp256k1_scalar *psVar12;
  secp256k1_sha256 *psVar13;
  secp256k1_gej *psVar14;
  secp256k1_gej *psVar15;
  secp256k1_ge *elem;
  code *cb;
  secp256k1_fe *unaff_R12;
  secp256k1_sha256 *hash;
  secp256k1_ge *unaff_R13;
  secp256k1_scalar *psVar16;
  secp256k1_gej *psVar17;
  secp256k1_sha256 *psVar18;
  bool bVar19;
  ulong uStack_2078;
  secp256k1_strauss_state sStack_2070;
  secp256k1_fe asStack_2058 [8];
  secp256k1_strauss_point_state sStack_1f18;
  secp256k1_ge asStack_1b08 [8];
  size_t *psStack_1840;
  secp256k1_gej *psStack_1838;
  secp256k1_gej *psStack_1830;
  secp256k1_sha256 *psStack_1828;
  secp256k1_gej *psStack_1820;
  secp256k1_strauss_point_state *psStack_1818;
  size_t sStack_17f8;
  secp256k1_scalar sStack_17f0;
  secp256k1_scratch asStack_17d0 [2];
  secp256k1_ge sStack_1788;
  secp256k1_gej sStack_1730;
  secp256k1_gej sStack_16b0;
  secp256k1_gej sStack_1630;
  secp256k1_gej sStack_15b0;
  secp256k1_gej sStack_1530;
  secp256k1_gej asStack_14b0 [2];
  secp256k1_gej asStack_1370 [5];
  secp256k1_strauss_point_state sStack_10b0;
  secp256k1_scratch *psStack_c98;
  secp256k1_sha256 *psStack_c90;
  secp256k1_scalar *psStack_c88;
  secp256k1_gej *psStack_c80;
  secp256k1_gej *psStack_c78;
  secp256k1_scalar *psStack_c70;
  undefined4 uStack_c5e;
  undefined2 uStack_c5a;
  secp256k1_gej *psStack_c58;
  long lStack_c50;
  secp256k1_scalar sStack_c48;
  secp256k1_scalar sStack_c28;
  secp256k1_sha256 sStack_c08;
  secp256k1_sha256 sStack_b98;
  secp256k1_gej *psStack_b30;
  secp256k1_fe *psStack_b28;
  secp256k1_ge *psStack_b20;
  secp256k1_ge *psStack_b18;
  secp256k1_gej *psStack_b10;
  secp256k1_strauss_point_state *psStack_b08;
  undefined1 auStack_b00 [32];
  undefined1 auStack_ae0 [40];
  uint64_t uStack_ab8;
  uint64_t uStack_ab0;
  uint64_t uStack_aa8;
  uint64_t uStack_aa0;
  uint64_t uStack_a98;
  uint64_t uStack_a90;
  uint64_t uStack_a88;
  uint64_t uStack_a80;
  uint64_t uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 uStack_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  int iStack_a48;
  secp256k1_strauss_state sStack_a40;
  secp256k1_gej sStack_a28;
  secp256k1_gej sStack_9a8;
  secp256k1_gej sStack_928;
  secp256k1_ge sStack_8a8;
  secp256k1_fe asStack_850 [8];
  secp256k1_ge asStack_710 [8];
  secp256k1_strauss_point_state sStack_450;
  
  uVar4 = 0x20;
  do {
    uVar2 = (int)uVar4 - 1;
    uVar4 = (ulong)uVar2;
    if (wnaf[uVar4] != 0) {
      test_fixed_wnaf_small_helper_cold_1();
      goto LAB_0016308b;
    }
  } while (8 < uVar2);
  uVar2 = 7;
  while (wnaf[uVar2] == wnaf_expected[uVar2]) {
    bVar19 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar19) {
      return;
    }
  }
LAB_0016308b:
  test_fixed_wnaf_small_helper_cold_2();
  psVar17 = (secp256k1_gej *)auStack_b00;
  psVar11 = (secp256k1_strauss_point_state *)((ulong)wnaf_expected & 0xffffffff);
  psVar16 = (secp256k1_scalar *)auStack_ae0;
  psStack_b08 = (secp256k1_strauss_point_state *)0x1630b3;
  random_scalar_order_test(psVar16);
  psStack_b08 = (secp256k1_strauss_point_state *)0x1630c4;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_b00,psVar16,(secp256k1_scalar *)wnaf);
  psStack_b08 = (secp256k1_strauss_point_state *)0x1630cf;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_b00,(secp256k1_scalar *)auStack_b00);
  if ((int)wnaf_expected == 0) {
    psStack_b08 = (secp256k1_strauss_point_state *)0x163224;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_928,(secp256k1_scalar *)auStack_ae0);
    psStack_b08 = (secp256k1_strauss_point_state *)0x16323b;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_9a8,(secp256k1_scalar *)auStack_b00);
    psStack_b08 = (secp256k1_strauss_point_state *)0x163252;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_a28,(secp256k1_scalar *)wnaf);
  }
  else {
    psStack_b08 = (secp256k1_strauss_point_state *)0x1630e7;
    random_group_element_test(&sStack_8a8);
    iStack_a48 = sStack_8a8.infinity;
    auStack_ae0._32_8_ = sStack_8a8.x.n[0];
    uStack_ab8 = sStack_8a8.x.n[1];
    uStack_ab0 = sStack_8a8.x.n[2];
    uStack_aa8 = sStack_8a8.x.n[3];
    uStack_aa0 = sStack_8a8.x.n[4];
    uStack_a98 = sStack_8a8.y.n[0];
    uStack_a90 = sStack_8a8.y.n[1];
    uStack_a88 = sStack_8a8.y.n[2];
    uStack_a80 = sStack_8a8.y.n[3];
    uStack_a78 = sStack_8a8.y.n[4];
    uStack_a70 = 1;
    uStack_a68 = 0;
    uStack_a60 = 0;
    uStack_a58 = 0;
    uStack_a50 = 0;
    if ((int)wnaf_expected == 1) {
      unaff_R12 = asStack_850;
      unaff_R13 = asStack_710;
      psVar11 = &sStack_450;
      psVar16 = &test_ecmult_target::zero;
      psVar17 = (secp256k1_gej *)(auStack_ae0 + 0x20);
      psStack_b08 = (secp256k1_strauss_point_state *)0x1631aa;
      sStack_9a8.x.n[0] = (uint64_t)unaff_R12;
      sStack_9a8.x.n[1] = (uint64_t)unaff_R13;
      sStack_9a8.x.n[2] = (uint64_t)psVar11;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_9a8,&sStack_928,1,psVar17,
                 (secp256k1_scalar *)auStack_ae0,&test_ecmult_target::zero);
      psStack_b08 = (secp256k1_strauss_point_state *)0x1631d8;
      sStack_a28.x.n[0] = (uint64_t)unaff_R12;
      sStack_a28.x.n[1] = (uint64_t)unaff_R13;
      sStack_a28.x.n[2] = (uint64_t)psVar11;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_a28,&sStack_9a8,1,psVar17,
                 (secp256k1_scalar *)auStack_b00,&test_ecmult_target::zero);
      psStack_b08 = (secp256k1_strauss_point_state *)0x163206;
      sStack_a40.aux = unaff_R12;
      sStack_a40.pre_a = unaff_R13;
      sStack_a40.ps = psVar11;
      secp256k1_ecmult_strauss_wnaf
                (&sStack_a40,&sStack_a28,1,psVar17,(secp256k1_scalar *)wnaf,
                 &test_ecmult_target::zero);
    }
    else {
      psVar16 = (secp256k1_scalar *)&sStack_8a8;
      psStack_b08 = (secp256k1_strauss_point_state *)0x163271;
      secp256k1_ecmult_const(&sStack_928,(secp256k1_ge *)psVar16,(secp256k1_scalar *)auStack_ae0);
      psStack_b08 = (secp256k1_strauss_point_state *)0x163284;
      secp256k1_ecmult_const(&sStack_9a8,(secp256k1_ge *)psVar16,(secp256k1_scalar *)auStack_b00);
      psStack_b08 = (secp256k1_strauss_point_state *)0x163297;
      secp256k1_ecmult_const(&sStack_a28,(secp256k1_ge *)psVar16,(secp256k1_scalar *)wnaf);
      psVar17 = (secp256k1_gej *)auStack_b00;
    }
  }
  psStack_b08 = (secp256k1_strauss_point_state *)0x1632b4;
  secp256k1_gej_add_var(&sStack_a28,&sStack_a28,&sStack_928,(secp256k1_fe *)0x0);
  psStack_b08 = (secp256k1_strauss_point_state *)0x1632c9;
  psVar14 = &sStack_a28;
  psVar15 = &sStack_a28;
  secp256k1_gej_add_var(&sStack_a28,&sStack_a28,&sStack_9a8,(secp256k1_fe *)0x0);
  if (sStack_a28.infinity != 0) {
    return;
  }
  psStack_b08 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  psVar12 = (secp256k1_scalar *)((ulong)psVar15 & 0xffffffff);
  psStack_c70 = (secp256k1_scalar *)0x163319;
  psStack_c58 = psVar14;
  lStack_c50 = extraout_RDX;
  psStack_b30 = &sStack_a28;
  psStack_b28 = unaff_R12;
  psStack_b20 = unaff_R13;
  psStack_b18 = (secp256k1_ge *)psVar16;
  psStack_b10 = psVar17;
  psStack_b08 = psVar11;
  psVar5 = secp256k1_scratch_create(&CTX->error_callback,0x10000);
  uStack_c5e = SUB84(psVar15,0);
  psVar18 = &sStack_b98;
  sStack_b98.s[0] = 0x6a09e667;
  sStack_b98.s[1] = 0xbb67ae85;
  sStack_b98.s[2] = 0x3c6ef372;
  sStack_b98.s[3] = 0xa54ff53a;
  sStack_b98.s[4] = 0x510e527f;
  sStack_b98.s[5] = 0x9b05688c;
  sStack_b98.s[6] = 0x1f83d9ab;
  sStack_b98.s[7] = 0x5be0cd19;
  psVar14 = (secp256k1_gej *)0x0;
  sStack_b98.bytes = 0;
  sStack_c28.d[0] = 0;
  sStack_c28.d[1] = 0;
  sStack_c28.d[2] = 0;
  sStack_c28.d[3] = 0;
  psStack_c70 = (secp256k1_scalar *)0x163369;
  test_ecmult_accumulate(psVar18,&sStack_c28,psVar5);
  sStack_c28.d[0] = 1;
  sStack_c28.d[1] = 0;
  sStack_c28.d[2] = 0;
  sStack_c28.d[3] = 0;
  psStack_c70 = (secp256k1_scalar *)0x16338b;
  test_ecmult_accumulate(psVar18,&sStack_c28,psVar5);
  psStack_c70 = (secp256k1_scalar *)0x163396;
  secp256k1_scalar_negate(&sStack_c28,&sStack_c28);
  psStack_c70 = (secp256k1_scalar *)0x1633a7;
  test_ecmult_accumulate(psVar18,&sStack_c28,psVar5);
  psVar17 = psStack_c58;
  if (psStack_c58 != (secp256k1_gej *)0x0) {
    psVar14 = (secp256k1_gej *)0x0;
    psVar18 = &sStack_c08;
    psVar12 = &sStack_c48;
    do {
      uStack_c5a = SUB82(psVar14,0);
      sStack_c08.s[0] = 0x6a09e667;
      sStack_c08.s[1] = 0xbb67ae85;
      sStack_c08.s[2] = 0x3c6ef372;
      sStack_c08.s[3] = 0xa54ff53a;
      sStack_c08.s[4] = 0x510e527f;
      sStack_c08.s[5] = 0x9b05688c;
      sStack_c08.s[6] = 0x1f83d9ab;
      sStack_c08.s[7] = 0x5be0cd19;
      sStack_c08.bytes = 0;
      psStack_c70 = (secp256k1_scalar *)0x163403;
      secp256k1_sha256_write(psVar18,(uchar *)&uStack_c5e,6);
      psStack_c70 = (secp256k1_scalar *)0x16340e;
      secp256k1_sha256_finalize(psVar18,(uchar *)psVar12);
      psStack_c70 = (secp256k1_scalar *)0x16341b;
      secp256k1_scalar_set_b32(&sStack_c28,(uchar *)psVar12,(int *)0x0);
      psStack_c70 = (secp256k1_scalar *)0x16342e;
      test_ecmult_accumulate(&sStack_b98,&sStack_c28,psVar5);
      psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + 1);
    } while (psVar17 != psVar14);
  }
  hash = &sStack_b98;
  psVar16 = &sStack_c48;
  psStack_c70 = (secp256k1_scalar *)0x163448;
  secp256k1_sha256_finalize(hash,(uchar *)psVar16);
  lVar6 = 0;
  while (*(char *)((long)sStack_c48.d + lVar6) == *(char *)(lStack_c50 + lVar6)) {
    lVar6 = lVar6 + 1;
    if (lVar6 == 0x20) {
      psStack_c70 = (secp256k1_scalar *)0x163475;
      secp256k1_scratch_destroy(&CTX->error_callback,psVar5);
      return;
    }
  }
  psStack_c70 = (secp256k1_scalar *)test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  psStack_c78 = psVar17;
  sStack_17f0.d[2] = 0;
  sStack_17f0.d[3] = 0;
  sStack_17f0.d[0] = 0;
  sStack_17f0.d[1] = 0;
  sStack_17f8 = 0x41;
  sStack_1530.infinity = 0;
  sStack_1530.x.n[0] = 0x2815b16f81798;
  sStack_1530.x.n[1] = 0xdb2dce28d959f;
  sStack_1530.x.n[2] = 0xe870b07029bfc;
  sStack_1530.x.n[3] = 0xbbac55a06295c;
  sStack_1530.x.n[4] = 0x79be667ef9dc;
  sStack_1530.y.n[4] = 0x483ada7726a3;
  sStack_1530.y.n[0] = 0x7d08ffb10d4b8;
  sStack_1530.y.n[1] = 0x48a68554199c4;
  sStack_1530.y.n[2] = 0xe1108a8fd17b4;
  sStack_1530.y.n[3] = 0xc4655da4fbfc0;
  sStack_1530.z.n[0] = 1;
  sStack_1530.z.n[3] = 0;
  sStack_1530.z.n[4] = 0;
  sStack_1530.z.n[1] = 0;
  sStack_1530.z.n[2] = 0;
  sStack_15b0.infinity = 1;
  sStack_15b0.z.n[4] = 0;
  sStack_15b0.z.n[2] = 0;
  sStack_15b0.z.n[3] = 0;
  sStack_15b0.z.n[0] = 0;
  sStack_15b0.z.n[1] = 0;
  sStack_15b0.y.n[3] = 0;
  sStack_15b0.y.n[4] = 0;
  sStack_15b0.y.n[1] = 0;
  sStack_15b0.y.n[2] = 0;
  sStack_15b0.x.n[4] = 0;
  sStack_15b0.y.n[0] = 0;
  sStack_15b0.x.n[2] = 0;
  sStack_15b0.x.n[3] = 0;
  sStack_15b0.x.n[0] = 0;
  sStack_15b0.x.n[1] = 0;
  psStack_1818 = (secp256k1_strauss_point_state *)0x163571;
  psStack_c98 = psVar5;
  psStack_c90 = psVar18;
  psStack_c88 = &sStack_c28;
  psStack_c80 = psVar14;
  psStack_c70 = psVar12;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1630,psVar16);
  psStack_1818 = (secp256k1_strauss_point_state *)0x1635bc;
  sStack_1730.x.n[0] = (uint64_t)asStack_14b0;
  sStack_1730.x.n[1] = (uint64_t)asStack_1370;
  sStack_1730.x.n[2] = (uint64_t)&sStack_10b0;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1730,&sStack_16b0,1,&sStack_1530,psVar16,
             &sStack_17f0);
  psStack_1818 = (secp256k1_strauss_point_state *)0x1635ed;
  sStack_1788.x.n[0] = (uint64_t)asStack_14b0;
  sStack_1788.x.n[1] = (uint64_t)asStack_1370;
  sStack_1788.x.n[2] = (uint64_t)&sStack_10b0;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1788,&sStack_1730,1,&sStack_15b0,&sStack_17f0,
             psVar16);
  psStack_1818 = (secp256k1_strauss_point_state *)0x163616;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch,(secp256k1_gej *)&sStack_10b0,psVar16,
             (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  cb = test_ecmult_accumulate_cb;
  psStack_1818 = (secp256k1_strauss_point_state *)0x163641;
  psVar12 = psVar16;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch,asStack_1370,&sStack_17f0,test_ecmult_accumulate_cb,
             psVar16,1);
  psStack_1818 = (secp256k1_strauss_point_state *)0x16365b;
  secp256k1_ecmult_const(asStack_14b0,&secp256k1_ge_const_g,psVar16);
  psStack_1818 = (secp256k1_strauss_point_state *)0x163673;
  secp256k1_ge_set_gej_var(&sStack_1788,&sStack_1630);
  psStack_1818 = (secp256k1_strauss_point_state *)0x163683;
  ge_equals_gej(&sStack_1788,&sStack_16b0);
  psStack_1818 = (secp256k1_strauss_point_state *)0x16368e;
  ge_equals_gej(&sStack_1788,&sStack_1730);
  psStack_1818 = (secp256k1_strauss_point_state *)0x163699;
  ge_equals_gej(&sStack_1788,(secp256k1_gej *)&sStack_10b0);
  psStack_1818 = (secp256k1_strauss_point_state *)0x1636a4;
  ge_equals_gej(&sStack_1788,asStack_1370);
  psStack_1818 = (secp256k1_strauss_point_state *)0x1636af;
  ge_equals_gej(&sStack_1788,asStack_14b0);
  if (sStack_1788.infinity == 0) {
    elem = &sStack_1788;
    psVar5 = asStack_17d0;
    psVar16 = (secp256k1_scalar *)0x0;
    psStack_1818 = (secp256k1_strauss_point_state *)0x1636eb;
    secp256k1_eckey_pubkey_serialize(elem,psVar5->magic,&sStack_17f8,0);
    if (sStack_17f8 != 0x41) {
      psStack_1818 = (secp256k1_strauss_point_state *)secp256k1_ecmult_multi_var;
      test_ecmult_accumulate_cold_1();
      r->infinity = 1;
      (r->x).n[0] = 0;
      (r->x).n[1] = 0;
      (r->x).n[2] = 0;
      (r->x).n[3] = 0;
      (r->x).n[4] = 0;
      (r->y).n[0] = 0;
      (r->y).n[1] = 0;
      (r->y).n[2] = 0;
      (r->y).n[3] = 0;
      (r->y).n[4] = 0;
      (r->z).n[0] = 0;
      (r->z).n[1] = 0;
      (r->z).n[2] = 0;
      (r->z).n[3] = 0;
      (r->z).n[4] = 0;
      if (psVar16 != (secp256k1_scalar *)0x0 || hash != (secp256k1_sha256 *)0x0) {
        psStack_1840 = &sStack_17f8;
        psStack_1838 = &sStack_1730;
        psStack_1830 = asStack_1370;
        psStack_1828 = hash;
        psStack_1820 = asStack_14b0;
        psStack_1818 = &sStack_10b0;
        if (hash == (secp256k1_sha256 *)0x0) {
          sStack_2070.aux = asStack_2058;
          sStack_2070.pre_a = asStack_1b08;
          sStack_2070.ps = &sStack_1f18;
          secp256k1_ecmult_strauss_wnaf(&sStack_2070,r,1,r,&secp256k1_scalar_zero,psVar16);
        }
        else {
          if ((psVar5 == (secp256k1_scratch *)0x0) ||
             (sVar9 = secp256k1_pippenger_max_points((secp256k1_callback *)elem,psVar5), sVar9 == 0)
             ) {
LAB_0016396f:
            secp256k1_ecmult_multi_simple_var(r,psVar16,cb,psVar12,(size_t)hash);
            return;
          }
          uVar4 = 5000000;
          if (sVar9 < 5000000) {
            uVar4 = sVar9;
          }
          puVar1 = (undefined1 *)((long)&hash[-1].bytes + 7);
          uStack_2078 = (ulong)puVar1 / uVar4 + 1;
          uVar4 = (ulong)puVar1 / uStack_2078;
          if (uVar4 < 0x57) {
            lVar6 = 0;
            do {
              if (psVar5->magic[lVar6] != "scratch"[lVar6]) {
                (*(code *)(elem->x).n[0])("invalid scratch space",(elem->x).n[1]);
                goto LAB_0016396f;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 != 8);
            uVar10 = psVar5->max_size - psVar5->alloc_size;
            uVar4 = 0;
            if (0x4a < uVar10) {
              uVar4 = uVar10 - 0x4b;
            }
            if (uVar4 < 0x8b0) goto LAB_0016396f;
            uVar4 = uVar4 / 0x8b0;
            if (4999999 < uVar4) {
              uVar4 = 5000000;
            }
            uStack_2078 = (ulong)puVar1 / uVar4 + 1;
            uVar4 = (ulong)puVar1 / uStack_2078;
            pcVar7 = secp256k1_ecmult_strauss_batch;
          }
          else {
            pcVar7 = secp256k1_ecmult_pippenger_batch;
          }
          psVar18 = (secp256k1_sha256 *)(uVar4 + 1);
          lVar6 = 0;
          uVar4 = 0;
          do {
            psVar13 = psVar18;
            if (hash < psVar18) {
              psVar13 = hash;
            }
            psVar8 = (secp256k1_scalar *)0x0;
            if (uVar4 == 0) {
              psVar8 = psVar16;
            }
            iVar3 = (*pcVar7)(elem,psVar5,&sStack_1f18,psVar8,cb,psVar12,psVar13,lVar6);
            if (iVar3 == 0) {
              return;
            }
            secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_1f18,(secp256k1_fe *)0x0);
            hash = (secp256k1_sha256 *)((long)hash - (long)psVar13);
            uVar4 = uVar4 + 1;
            lVar6 = (long)psVar18->s + lVar6;
          } while (uStack_2078 != uVar4);
        }
      }
      return;
    }
    sVar9 = 0x41;
  }
  else {
    asStack_17d0[0].magic[0] = '\0';
    sVar9 = 1;
  }
  psStack_1818 = (secp256k1_strauss_point_state *)0x163703;
  secp256k1_sha256_write(hash,asStack_17d0[0].magic,sVar9);
  return;
}

Assistant:

static void test_fixed_wnaf_small_helper(int *wnaf, int *wnaf_expected, int w) {
    int i;
    for (i = WNAF_SIZE(w)-1; i >= 8; --i) {
        CHECK(wnaf[i] == 0);
    }
    for (i = 7; i >= 0; --i) {
        CHECK(wnaf[i] == wnaf_expected[i]);
    }
}